

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,8ul,void,void>>
::Naive_vector_column<std::vector<int,std::allocator<int>>>
          (Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,8ul,void,void>>
           *this,Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>
                 *column,Index columnIndex,vector<int,_std::allocator<int>_> *rowContainer,
          Column_settings *colSettings)

{
  pointer ppEVar1;
  pointer bg;
  Field_operators *pFVar2;
  reference ppEVar3;
  Field_operators *pFVar4;
  const_iterator __begin0;
  vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_**,_true>
  local_38;
  
  *(undefined8 *)this = *(undefined8 *)column;
  *(Index *)(this + 8) = (column->super_Chain_column_option).pairedColumn_;
  local_38.m_ptr =
       (Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>
        **)0x0;
  boost::container::
  small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>
  ::small_vector((small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>
                  *)(this + 0x10),
                 (column->column_).
                 super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
                 .super_type.m_holder.m_size,(value_type *)&local_38);
  pFVar4 = (Field_operators *)0x0;
  pFVar2 = column->operators_;
  if (colSettings != (Column_settings *)0x0) {
    pFVar2 = pFVar4;
  }
  *(Field_operators **)(this + 0x68) = pFVar2;
  if (colSettings == (Column_settings *)0x0) {
    colSettings = (Column_settings *)column->entryPool_;
  }
  *(Column_settings **)(this + 0x70) = colSettings;
  local_38.m_ptr =
       (column->column_).
       super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
       .super_type.m_holder.m_start;
  ppEVar1 = local_38.m_ptr +
            (column->column_).
            super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
            .super_type.m_holder.m_size;
  while (local_38.m_ptr != ppEVar1) {
    ppEVar3 = boost::container::
              vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_**,_true>
              ::operator*(&local_38);
    Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>
    ::_update_entry((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>
                     *)this,(*ppEVar3)->rowIndex_,(Index)pFVar4);
    pFVar4 = (Field_operators *)(ulong)((Index)pFVar4 + 1);
    boost::container::
    vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_**,_true>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

inline Naive_vector_column<Master_matrix,Support>::Naive_vector_column(const Naive_vector_column& column,
                                                               Index columnIndex,
                                                               Row_container* rowContainer,
                                                               Column_settings* colSettings)
    : RA_opt(columnIndex, rowContainer),
      Dim_opt(static_cast<const Dim_opt&>(column)),
      Chain_opt(static_cast<const Chain_opt&>(column)),
      column_(column.column_.size(), nullptr),
      operators_(colSettings == nullptr ? column.operators_ : nullptr),
      entryPool_(colSettings == nullptr ? column.entryPool_ : &(colSettings->entryConstructor))
{
  if constexpr (!Master_matrix::Option_list::is_z2) {
    if (colSettings != nullptr) operators_ = &(colSettings->operators);
  }

  Index i = 0;
  for (const Entry* entry : column.column_) {
    if constexpr (Master_matrix::Option_list::is_z2) {
      _update_entry(entry->get_row_index(), i++);
    } else {
      _update_entry(entry->get_element(), entry->get_row_index(), i++);
    }
  }
}